

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O1

void __thiscall Mat::clear(Mat *this)

{
  allocator_type local_29;
  vector<__int128,_std::allocator<__int128>_> local_28;
  
  std::vector<__int128,_std::allocator<__int128>_>::vector
            (&local_28,(long)this->c * (long)this->r,&local_29);
  std::vector<__int128,_std::allocator<__int128>_>::_M_move_assign(&this->val,&local_28);
  if (local_28.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_28.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Mat::clear() {
    val = vector<ll128>(r * c);
}